

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

void __thiscall GameLoop::distributeArmies(GameLoop *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  pointer ppCVar3;
  string *psVar4;
  pointer pcVar5;
  int *piVar6;
  _Alloc_hider _Var7;
  int iVar8;
  uint uVar9;
  result_type_conflict rVar10;
  Country **country;
  ostream *poVar11;
  pointer ppCVar12;
  int iVar13;
  size_t __i;
  long lVar14;
  int iVar15;
  ulong uVar16;
  Player *pPVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  uniform_int_distribution<int> distr;
  random_device rd;
  mt19937 eng;
  uniform_int_distribution<int> local_2760;
  ulong local_2758;
  GameLoop *local_2750;
  ulong local_2748;
  anon_union_5000_2_650ea050_for_random_device_0 local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  ppPVar1 = (this->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppPVar2 = (this->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar18 = (long)ppPVar2 - (long)ppPVar1 >> 3;
  iVar13 = (int)uVar18;
  iVar15 = 0;
  if (iVar13 - 2U < 5) {
    iVar15 = iVar13 * -5 + 0x32;
  }
  local_2750 = this;
  if (ppPVar2 != ppPVar1) {
    pPVar17 = *ppPVar1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nEach player has ",0x11);
    poVar11 = (ostream *)std::ostream::operator<<(&std::cout,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11," armies to place on their countries. \n",0x26);
    if (0 < iVar13) {
      uVar16 = 0;
      iVar13 = 0;
      uVar19 = uVar18;
      local_2758 = uVar18;
      do {
        ppCVar3 = (pPVar17->pOwnedCountries->
                  super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppCVar12 = (pPVar17->pOwnedCountries->
                        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl
                        .super__Vector_impl_data._M_start; ppCVar12 != ppCVar3;
            ppCVar12 = ppCVar12 + 1) {
          *(*ppCVar12)->pNumberOfTroops = 1;
        }
        psVar4 = pPVar17->strategy->strategyName;
        pcVar5 = (psVar4->_M_dataplus)._M_p;
        local_2748 = uVar16;
        local_2740.field_0._M_file = &local_2740.field_0._M_fd;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2740,pcVar5,pcVar5 + psVar4->_M_string_length);
        iVar8 = std::__cxx11::string::compare((char *)&local_2740);
        if ((int *)local_2740.field_0._M_file != &local_2740.field_0._M_fd) {
          operator_delete(local_2740.field_0._M_file,local_2740._M_mt._M_x[2] + 1);
        }
        if (iVar8 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Placing 1 army per country.",0x1b);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
          std::ostream::put(-0x80);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player ",7);
          poVar11 = (ostream *)std::ostream::operator<<(&std::cout,*pPVar17->pPlayerId);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11," , please place your armies. Here is your list of countries :\n",0x3e)
          ;
          if ((pPVar17->pOwnedCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish ==
              (pPVar17->pOwnedCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_start) {
            uVar18 = 0;
          }
          else {
            uVar16 = 0;
            do {
              poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," - ",3);
              ppCVar12 = (pPVar17->pOwnedCountries->
                         super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                         _M_impl.super__Vector_impl_data._M_start;
              uVar18 = (long)(pPVar17->pOwnedCountries->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar12 >> 3;
              if (uVar18 <= uVar16) goto LAB_00111220;
              psVar4 = ppCVar12[uVar16]->cyName;
              local_2740.field_0._M_file = &local_2740.field_0._M_fd;
              _Var7._M_p = (psVar4->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2740,_Var7._M_p,_Var7._M_p + psVar4->_M_string_length);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)local_2740.field_0._M_file,
                                   local_2740._M_mt._M_x[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
              if ((int *)local_2740.field_0._M_file != &local_2740.field_0._M_fd) {
                operator_delete(local_2740.field_0._M_file,local_2740._M_mt._M_x[2] + 1);
              }
              uVar18 = (long)(pPVar17->pOwnedCountries->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pPVar17->pOwnedCountries->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_start >> 3;
              uVar19 = uVar16 + 2;
              uVar16 = uVar16 + 1;
            } while (uVar19 <= uVar18);
          }
          uVar19 = local_2758;
          iVar8 = (int)uVar18 + 1;
          if (iVar8 <= iVar15) {
            do {
              do {
                do {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\nWhere do you place army number ",0x20);
                  poVar11 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
                  std::istream::operator>>((istream *)&std::cin,(int *)&local_2740);
                  std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13e528);
                  std::istream::ignore((long)&std::cin,0x200);
                } while ((int)local_2740._M_mt._M_x[0]._0_4_ < 1);
                ppCVar12 = (pPVar17->pOwnedCountries->
                           super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                uVar18 = (long)(pPVar17->pOwnedCountries->
                               super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar12 >> 3;
              } while ((int)uVar18 < (int)local_2740._M_mt._M_x[0]._0_4_);
              uVar16 = (ulong)(local_2740._M_mt._M_x[0]._0_4_ - 1);
              if (uVar18 <= uVar16) goto LAB_00111220;
              piVar6 = ppCVar12[uVar16]->pNumberOfTroops;
              *piVar6 = *piVar6 + 1;
              bVar20 = iVar8 != iVar15;
              iVar8 = iVar8 + 1;
            } while (bVar20);
          }
        }
        else {
          std::random_device::random_device((random_device *)&local_2740.field_0);
          uVar9 = std::random_device::_M_getval();
          local_13b8._M_x[0] = (unsigned_long)uVar9;
          lVar14 = 1;
          uVar18 = local_13b8._M_x[0];
          do {
            uVar18 = (ulong)(((uint)(uVar18 >> 0x1e) ^ (uint)uVar18) * 0x6c078965 + (int)lVar14);
            local_13b8._M_x[lVar14] = uVar18;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x270);
          local_13b8._M_p = 0x270;
          local_2760._M_param._M_a = 1;
          local_2760._M_param._M_b =
               (int)((ulong)((long)(pPVar17->pOwnedCountries->
                                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pPVar17->pOwnedCountries->
                                  super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 3);
          if (local_2760._M_param._M_b + 1 <= iVar15) {
            iVar8 = iVar15 - local_2760._M_param._M_b;
            do {
              rVar10 = std::uniform_int_distribution<int>::operator()
                                 (&local_2760,&local_13b8,&local_2760._M_param);
              ppCVar12 = (pPVar17->pOwnedCountries->
                         super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                         _M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(pPVar17->pOwnedCountries->
                                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar12 >> 3) <=
                  (ulong)(long)(rVar10 + -1)) {
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
              }
              piVar6 = ppCVar12[rVar10 + -1]->pNumberOfTroops;
              *piVar6 = *piVar6 + 1;
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
          }
          std::random_device::_M_fini();
        }
        uVar16 = (ulong)(((int)local_2748 + 1) % (int)uVar19);
        ppPVar1 = (local_2750->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar18 = (long)(local_2750->allPlayers->
                       super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3;
        if (uVar18 <= uVar16) goto LAB_00111220;
        pPVar17 = ppPVar1[uVar16];
        iVar13 = iVar13 + 1;
      } while (iVar13 != (int)uVar19);
    }
    return;
  }
  uVar16 = 0;
LAB_00111220:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar16,
             uVar18);
}

Assistant:

void GameLoop::distributeArmies() {
    int numberOfPlayers = allPlayers->size();
    int numberOfArmies = getNumberOfArmies(numberOfPlayers);
    int currentPlayerPosition = 0;
    Player* currentPlayer = allPlayers->at(currentPlayerPosition);
    int counter = 0;
    cout << "\nEach player has " << numberOfArmies << " armies to place on their countries. \n";
    while (counter < numberOfPlayers) {
        //place one troop per country
        for (auto& country : *currentPlayer->getOwnedCountries()) {
            country->setNumberOfTroops(1);
        }

        if (currentPlayer->getStrategy()->getStrategyName() == "HUMAN") {
            cout << "Placing 1 army per country." << std::endl;
            cout << "Player " << currentPlayer->getPlayerId()
                 << " , please place your armies. Here is your list of countries :\n";
            for (unsigned long i = 1; i <= currentPlayer->getOwnedCountries()->size(); i++) {
                cout << i << " - " << currentPlayer->getOwnedCountries()->at(i - 1)->getCountryName() << "\n";
            }
            for (int i = int(currentPlayer->getOwnedCountries()->size() + 1); i <= numberOfArmies; i++) {
                int countryToPlaceOn;
                do {
                    cout << "\nWhere do you place army number " << i << ": ";
                    cin >> countryToPlaceOn;
                    cin.clear();
                    cin.ignore(512, '\n');
                } while (countryToPlaceOn < 1 || countryToPlaceOn > int(currentPlayer->getOwnedCountries()->size()) ||
                         isnan(countryToPlaceOn));
                Map::Country* currCountry = currentPlayer->getOwnedCountries()->at(countryToPlaceOn - 1);
                currCountry->setNumberOfTroops(currCountry->getNumberOfTroops() + 1);
            }
        } else {
            std::random_device rd;
            std::mt19937 eng(rd());
            std::uniform_int_distribution<> distr(1, int(currentPlayer->getOwnedCountries()->size()));
            //place troops randomly
            for (int i = int(currentPlayer->getOwnedCountries()->size() + 1); i <= numberOfArmies; i++) {
                int countryToPlaceOn = distr(eng);
                Map::Country* currCountry = currentPlayer->getOwnedCountries()->at(countryToPlaceOn - 1);
                currCountry->setNumberOfTroops(currCountry->getNumberOfTroops() + 1);
            }
        }
        currentPlayerPosition++;
        currentPlayerPosition = currentPlayerPosition % numberOfPlayers;
        currentPlayer = allPlayers->at(currentPlayerPosition);
        counter++;
    }
}